

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_39(QPDF *pdf,char *arg2)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  QPDFObjectHandle image_dict;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  images;
  allocator<char> local_13e;
  allocator<char> local_13d;
  int local_13c;
  long local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_128;
  long local_120;
  long local_118;
  long local_110;
  string local_100 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  string local_f0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  local_e0;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&local_e0,pdf);
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&local_e0);
  local_120 = local_110;
  local_13c = 0;
  while (local_138 = local_118, local_118 != local_120) {
    poVar1 = std::operator<<((ostream *)&std::cout,"page ");
    local_13c = local_13c + 1;
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,local_13c);
    std::endl<char,std::char_traits<char>>(poVar1);
    QPDFPageObjectHelper::getImages_abi_cxx11_();
    for (p_Var2 = local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &local_e0._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      QPDFObjectHandle::getDict();
      poVar1 = std::operator<<((ostream *)&std::cout,"filter: ");
      std::__cxx11::string::string<std::allocator<char>>(local_b0,"/Filter",&local_13d);
      QPDFObjectHandle::getKey(local_f0);
      QPDFObjectHandle::unparseResolved_abi_cxx11_();
      poVar1 = std::operator<<(poVar1,local_90);
      poVar1 = std::operator<<(poVar1,", color space: ");
      std::__cxx11::string::string<std::allocator<char>>(local_70,"/ColorSpace",&local_13e);
      QPDFObjectHandle::getKey(local_100);
      QPDFObjectHandle::unparseResolved_abi_cxx11_();
      poVar1 = std::operator<<(poVar1,local_50);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::__cxx11::string::~string(local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_90);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8);
      std::__cxx11::string::~string(local_b0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
    ::~_Rb_tree(&local_e0);
    local_118 = local_138 + 0x38;
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_118);
  return;
}

Assistant:

static void
test_39(QPDF& pdf, char const* arg2)
{
    // Display image filter and color set for each image on each page
    int pageno = 0;
    for (auto& page: QPDFPageDocumentHelper(pdf).getAllPages()) {
        std::cout << "page " << ++pageno << std::endl;
        std::map<std::string, QPDFObjectHandle> images = page.getImages();
        for (auto& i_iter: images) {
            QPDFObjectHandle image_dict = i_iter.second.getDict();
            std::cout << "filter: " << image_dict.getKey("/Filter").unparseResolved()
                      << ", color space: " << image_dict.getKey("/ColorSpace").unparseResolved()
                      << std::endl;
        }
    }
}